

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_SetPropertyValue(JSContext *ctx,JSValue this_obj,JSValue prop,JSValue val,int flags)

{
  uint16_t uVar1;
  long lVar2;
  int64_t iVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  JSAtom prop_00;
  JSObject *pJVar7;
  uint uVar8;
  JSValueUnion JVar9;
  long lVar10;
  JSValueUnion p;
  uint uVar11;
  JSValue v;
  JSValue this_obj_00;
  JSValueUnion local_48;
  int local_3c;
  JSValueUnion local_38;
  
  JVar9 = prop.u;
  this_obj_00.tag = this_obj.tag;
  p = this_obj.u;
  local_3c = flags;
  local_38 = p;
  if (((int)this_obj.tag != -1) ||
     (((undefined1  [16])prop & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0))
  goto LAB_001207be;
  bVar4 = false;
  uVar5 = *(ushort *)((long)p.ptr + 6) - 8;
  pJVar7 = (JSObject *)(ulong)uVar5;
  uVar11 = prop.u._0_4_;
  uVar8 = (uint)val.tag;
  switch(pJVar7) {
  case (JSObject *)0x0:
    if (uVar11 < *(uint *)((long)p.ptr + 0x40)) {
LAB_001206c8:
      lVar2 = *(long *)((long)p.ptr + 0x38);
      lVar10 = ((ulong)JVar9.ptr & 0xffffffff) * 0x10;
      local_48 = (JSValueUnion)((JSValueUnion *)(lVar2 + lVar10))->ptr;
      iVar3 = *(int64_t *)(lVar2 + 8 + lVar10);
      *(JSValueUnion *)(lVar2 + lVar10) = val.u;
      ((JSValueUnion *)(lVar2 + lVar10))[1] = (JSValueUnion)val.tag;
      if ((0xfffffff4 < (uint)iVar3) &&
         (iVar6 = *local_48.ptr, *(int *)local_48.ptr = iVar6 + -1, iVar6 < 2)) {
        v.tag = iVar3;
        v.u.ptr = local_48.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
      goto LAB_001207b3;
    }
LAB_00120872:
    uVar5 = (uint)pJVar7;
    bVar4 = false;
    break;
  case (JSObject *)0x1:
  case (JSObject *)0x2:
  case (JSObject *)0x3:
  case (JSObject *)0x4:
  case (JSObject *)0x5:
  case (JSObject *)0x6:
  case (JSObject *)0x7:
  case (JSObject *)0x8:
  case (JSObject *)0x9:
  case (JSObject *)0xa:
  case (JSObject *)0xb:
  case (JSObject *)0xc:
    break;
  case (JSObject *)0xd:
    iVar6 = JS_ToUint8ClampFree(ctx,&local_48.int32,val);
    goto LAB_0012068b;
  case (JSObject *)0xe:
  case (JSObject *)0xf:
    iVar6 = JS_ToInt32Free(ctx,&local_48.int32,val);
LAB_0012068b:
    uVar5 = 0xffffffff;
    bVar4 = true;
    if (iVar6 == 0) {
      if (*(uint *)((long)p.ptr + 0x40) <= uVar11) {
LAB_00120858:
        uVar5 = JS_ThrowTypeErrorOrFalse(ctx,local_3c,"out-of-bound numeric index");
        goto LAB_001207b8;
      }
      *(undefined1 *)(*(long *)((long)p.ptr + 0x38) + ((ulong)JVar9.ptr & 0xffffffff)) =
           local_48.int32._0_1_;
LAB_001206b4:
      bVar4 = true;
      uVar5 = 1;
    }
    break;
  case (JSObject *)0x10:
  case (JSObject *)0x11:
    iVar6 = JS_ToInt32Free(ctx,&local_48.int32,val);
    uVar5 = 0xffffffff;
    bVar4 = true;
    if (iVar6 != 0) break;
    if (*(uint *)((long)p.ptr + 0x40) <= uVar11) goto LAB_00120858;
    *(undefined2 *)(*(long *)((long)p.ptr + 0x38) + ((ulong)JVar9.ptr & 0xffffffff) * 2) =
         local_48.int32._0_2_;
    goto LAB_001206b4;
  case (JSObject *)0x12:
  case (JSObject *)0x13:
    iVar6 = JS_ToInt32Free(ctx,&local_48.int32,val);
    uVar5 = 0xffffffff;
    bVar4 = true;
    if (iVar6 != 0) break;
    if (uVar11 < *(uint *)((long)p.ptr + 0x40)) {
      *(int32_t *)(*(long *)((long)p.ptr + 0x38) + ((ulong)JVar9.ptr & 0xffffffff) * 4) =
           local_48.int32;
      goto LAB_001206b4;
    }
    goto LAB_00120858;
  case (JSObject *)0x14:
    if (uVar8 < 3) {
      local_48.float64 = (double)val.u._0_4_;
LAB_00120794:
      if (*(uint *)((long)p.ptr + 0x40) <= uVar11) goto LAB_00120858;
      *(float *)(*(long *)((long)p.ptr + 0x38) + ((ulong)JVar9.ptr & 0xffffffff) * 4) =
           (float)local_48.float64;
      goto LAB_001207b3;
    }
    if (uVar8 == 7) {
      local_48 = val.u;
      goto LAB_00120794;
    }
    iVar6 = __JS_ToFloat64Free(ctx,&local_48.float64,val);
    if (iVar6 == 0) goto LAB_00120794;
LAB_0012078d:
    uVar5 = 0xffffffff;
    goto LAB_001207b8;
  case (JSObject *)0x15:
    if (uVar8 < 3) {
      local_48.float64 = (double)val.u._0_4_;
    }
    else if (uVar8 == 7) {
      local_48 = val.u;
    }
    else {
      iVar6 = __JS_ToFloat64Free(ctx,&local_48.float64,val);
      if (iVar6 != 0) goto LAB_0012078d;
    }
    if (*(uint *)((long)p.ptr + 0x40) <= uVar11) goto LAB_00120858;
    ((JSValueUnion *)(*(long *)((long)p.ptr + 0x38) + ((ulong)JVar9.ptr & 0xffffffff) * 8))->float64
         = (double)local_48;
LAB_001207b3:
    uVar5 = 1;
LAB_001207b8:
    bVar4 = true;
    break;
  default:
    if (*(ushort *)((long)p.ptr + 6) == 2) {
      uVar5 = *(uint *)((long)p.ptr + 0x40);
      pJVar7 = (JSObject *)(ulong)uVar5;
      if (uVar11 < uVar5) goto LAB_001206c8;
      if ((uVar5 == uVar11) &&
         (pJVar7 = (JSObject *)(ulong)CONCAT31((int3)(uVar5 >> 8),~*(byte *)((long)p.ptr + 5)),
         (~*(byte *)((long)p.ptr + 5) & 9) == 0)) {
        for (pJVar7 = (*(JSShape **)((long)p.ptr + 0x18))->proto; pJVar7 != (JSObject *)0x0;
            pJVar7 = pJVar7->shape->proto) {
          uVar1 = (pJVar7->field_0).header.dummy2;
          if (uVar1 == 1) {
            if (pJVar7->shape->has_small_array_index != '\0') goto LAB_00120872;
          }
          else if ((uVar1 != 2) || (((pJVar7->field_0).header.dummy1 & 8) == 0)) goto LAB_00120872;
        }
        uVar5 = add_fast_array_element(ctx,(JSObject *)p.ptr,val,flags);
        goto LAB_001207b8;
      }
      goto LAB_00120872;
    }
  }
  if (!bVar4) {
LAB_001207be:
    prop_00 = JS_ValueToAtom(ctx,prop);
    local_48 = JVar9;
    if ((0xfffffff4 < (uint)prop.tag) &&
       (iVar6 = *JVar9.ptr, *(int *)JVar9.ptr = iVar6 + -1, iVar6 < 2)) {
      __JS_FreeValueRT(ctx->rt,prop);
    }
    if (prop_00 == 0) {
      JS_FreeValue(ctx,val);
      uVar5 = 0xffffffff;
    }
    else {
      this_obj_00.u.ptr = local_38.ptr;
      uVar5 = JS_SetPropertyInternal(ctx,this_obj_00,prop_00,val,local_3c);
      JS_FreeAtom(ctx,prop_00);
    }
  }
  return uVar5;
}

Assistant:

static int JS_SetPropertyValue(JSContext *ctx, JSValueConst this_obj,
                               JSValue prop, JSValue val, int flags)
{
    if (likely(JS_VALUE_GET_TAG(this_obj) == JS_TAG_OBJECT &&
               JS_VALUE_GET_TAG(prop) == JS_TAG_INT)) {
        JSObject *p;
        uint32_t idx;
        double d;
        int32_t v;

        /* fast path for array access */
        p = JS_VALUE_GET_OBJ(this_obj);
        idx = JS_VALUE_GET_INT(prop);
        switch(p->class_id) {
        case JS_CLASS_ARRAY:
            if (unlikely(idx >= (uint32_t)p->u.array.count)) {
                JSObject *p1;
                JSShape *sh1;

                /* fast path to add an element to the array */
                if (idx != (uint32_t)p->u.array.count ||
                    !p->fast_array || !p->extensible)
                    goto slow_path;
                /* check if prototype chain has a numeric property */
                p1 = p->shape->proto;
                while (p1 != NULL) {
                    sh1 = p1->shape;
                    if (p1->class_id == JS_CLASS_ARRAY) {
                        if (unlikely(!p1->fast_array))
                            goto slow_path;
                    } else if (p1->class_id == JS_CLASS_OBJECT) {
                        if (unlikely(sh1->has_small_array_index))
                            goto slow_path;
                    } else {
                        goto slow_path;
                    }
                    p1 = sh1->proto;
                }
                /* add element */
                return add_fast_array_element(ctx, p, val, flags);
            }
            set_value(ctx, &p->u.array.u.values[idx], val);
            break;
        case JS_CLASS_ARGUMENTS:
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto slow_path;
            set_value(ctx, &p->u.array.u.values[idx], val);
            break;
        case JS_CLASS_UINT8C_ARRAY:
            if (JS_ToUint8ClampFree(ctx, &v, val))
                return -1;
            /* Note: the conversion can detach the typed array, so the
               array bound check must be done after */
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint8_ptr[idx] = v;
            break;
        case JS_CLASS_INT8_ARRAY:
        case JS_CLASS_UINT8_ARRAY:
            if (JS_ToInt32Free(ctx, &v, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint8_ptr[idx] = v;
            break;
        case JS_CLASS_INT16_ARRAY:
        case JS_CLASS_UINT16_ARRAY:
            if (JS_ToInt32Free(ctx, &v, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint16_ptr[idx] = v;
            break;
        case JS_CLASS_INT32_ARRAY:
        case JS_CLASS_UINT32_ARRAY:
            if (JS_ToInt32Free(ctx, &v, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint32_ptr[idx] = v;
            break;
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT64_ARRAY:
        case JS_CLASS_BIG_UINT64_ARRAY:
            /* XXX: need specific conversion function */
            {
                int64_t v;
                if (JS_ToBigInt64Free(ctx, &v, val))
                    return -1;
                if (unlikely(idx >= (uint32_t)p->u.array.count))
                    goto ta_out_of_bound;
                p->u.array.u.uint64_ptr[idx] = v;
            }
            break;
#endif
        case JS_CLASS_FLOAT32_ARRAY:
            if (JS_ToFloat64Free(ctx, &d, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.float_ptr[idx] = d;
            break;
        case JS_CLASS_FLOAT64_ARRAY:
            if (JS_ToFloat64Free(ctx, &d, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count)) {
            ta_out_of_bound:
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "out-of-bound numeric index");
            }
            p->u.array.u.double_ptr[idx] = d;
            break;
        default:
            goto slow_path;
        }
        return TRUE;
    } else {
        JSAtom atom;
        int ret;
    slow_path:
        atom = JS_ValueToAtom(ctx, prop);
        JS_FreeValue(ctx, prop);
        if (unlikely(atom == JS_ATOM_NULL)) {
            JS_FreeValue(ctx, val);
            return -1;
        }
        ret = JS_SetPropertyInternal(ctx, this_obj, atom, val, flags);
        JS_FreeAtom(ctx, atom);
        return ret;
    }
}